

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O3

REF_STATUS ref_acceptance_g(REF_NODE ref_node,char *function_name,REF_DBL *scalar)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  REF_DBL *pRVar5;
  double dVar6;
  double __x;
  
  iVar2 = ref_node->max;
  if (iVar2 < 1) {
    return 0;
  }
  pRVar5 = scalar + 2;
  lVar4 = 1;
  lVar3 = 0;
  do {
    if (-1 < ref_node->global[lVar3]) {
      iVar2 = strcmp(function_name,"parabola");
      if (iVar2 != 0) {
        printf("%s: %d: %s %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
               ,0x196,"unknown user function",function_name);
        return 5;
      }
      dVar1 = ref_node->real[lVar4];
      __x = (ref_node->real[lVar4 + -1] - dVar1 * dVar1) * 50.0;
      dVar6 = cosh(__x);
      pRVar5[-2] = 50.0 / (dVar6 * dVar6);
      dVar6 = cosh(__x);
      pRVar5[-1] = (dVar1 * -100.0) / (dVar6 * dVar6);
      *pRVar5 = 0.0;
      iVar2 = ref_node->max;
    }
    lVar3 = lVar3 + 1;
    pRVar5 = pRVar5 + 3;
    lVar4 = lVar4 + 0xf;
  } while (lVar3 < iVar2);
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_g(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_DBL *scalar) {
  REF_INT node;
  REF_DBL x, y;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    y = ref_node_xyz(ref_node, 1, node);
    if (strcmp(function_name, "parabola") == 0) {
      /* tanh(50 * (x - y * y)) */
      scalar[0 + 3 * node] = 50.0 / pow(cosh(50 * (x - y * y)), 2);
      scalar[1 + 3 * node] = -100.0 * y / pow(cosh(50 * (x - y * y)), 2);
      scalar[2 + 3 * node] = 0.0;
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}